

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

IsoHeaderData * IsoHeaderData::normal(void)

{
  uint32_t uVar1;
  time_t tVar2;
  IsoHeaderData *in_RDI;
  uint32_t local_74;
  string local_70;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator<char> local_11 [9];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"*tsMuxeR git-7f8667d",local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"*tsMuxeR ",&local_49);
  local_74 = random32();
  int32uToHex_abi_cxx11_(&local_70,&local_74);
  std::operator+(&in_RDI->impId,&local_48,&local_70);
  tVar2 = time((time_t *)0x0);
  in_RDI->fileTime = tVar2;
  uVar1 = random32();
  in_RDI->volumeId = uVar1;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::~allocator(local_11);
  return in_RDI;
}

Assistant:

IsoHeaderData IsoHeaderData::normal()
{
    return IsoHeaderData{"*tsMuxeR " TSMUXER_VERSION, std::string("*tsMuxeR ") + int32uToHex(random32()), time(nullptr),
                         random32()};
}